

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboRenderTest.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::FboCases::RecreateBuffersTest::RecreateBuffersTest
          (RecreateBuffersTest *this,Context *context,FboConfig *config,deUint32 buffers,bool rebind
          )

{
  char *__rhs;
  undefined7 in_register_00000081;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  FboConfig::getName_abi_cxx11_(&local_50,config);
  __rhs = "_no_rebind";
  if ((int)CONCAT71(in_register_00000081,rebind) != 0) {
    __rhs = "";
  }
  std::operator+(&local_70,&local_50,__rhs);
  FboRenderCase::FboRenderCase
            (&this->super_FboRenderCase,context,local_70._M_dataplus._M_p,"Recreate buffers",config)
  ;
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  (this->super_FboRenderCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00c260c0;
  this->m_buffers = buffers;
  this->m_rebind = rebind;
  return;
}

Assistant:

RecreateBuffersTest::RecreateBuffersTest (Context& context, const FboConfig& config, deUint32 buffers, bool rebind)
	: FboRenderCase		(context, (string(config.getName()) + (rebind ? "" : "_no_rebind")).c_str(), "Recreate buffers", config)
	, m_buffers			(buffers)
	, m_rebind			(rebind)
{
}